

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int buffer_realloc(BUFFER *buf,size_t alloc)

{
  void *pvVar1;
  int iVar2;
  
  iVar2 = 0;
  if (buf->alloc != alloc) {
    if (alloc == 0) {
      free(buf->data);
      buf->data = (void *)0x0;
      buf->size = 0;
      buf->alloc = 0;
      iVar2 = 0;
    }
    else {
      pvVar1 = realloc(buf->data,alloc);
      if (pvVar1 == (void *)0x0) {
        iVar2 = -1;
      }
      else {
        buf->data = pvVar1;
        buf->alloc = alloc;
        if (alloc < buf->size) {
          buf->size = alloc;
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int
buffer_realloc(BUFFER* buf, size_t alloc)
{
    void* tmp;

    if(alloc == buf->alloc)
        return 0;

    if(alloc == 0) {
        free(buf->data);
        buffer_init(buf);
        return 0;
    }

    tmp = realloc(buf->data, alloc);
    if(tmp == NULL)
        return -1;

    buf->data = tmp;
    buf->alloc = alloc;
    if(alloc < buf->size)
        buf->size = alloc;
    return 0;
}